

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O0

void __thiscall
program_options::required_option::required_option(required_option *this,string *option_name)

{
  undefined8 *in_RDI;
  int in_stack_000001f4;
  string *in_stack_000001f8;
  string *in_stack_00000200;
  string *in_stack_00000208;
  error_with_option_name *in_stack_00000210;
  allocator<char> local_69;
  string local_68 [24];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  error_with_option_name::error_with_option_name
            (in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8,
             in_stack_000001f4);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  *in_RDI = &PTR__required_option_00152d10;
  return;
}

Assistant:

required_option(const std::string& option_name)
   : error_with_option_name("the option '%canonical_option%' is required but missing", "", option_name)
   {
   }